

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O3

void __thiscall
TimerManager::removeTimedEvent(TimerManager *this,Id eventId,IEventDispatcher *dispatcher)

{
  ulong uVar1;
  AutoLock l;
  AutoLock AStack_38;
  
  AutoLock::AutoLock(&AStack_38,&this->mMutex);
  if ((this->mTimers).mSize != 0) {
    uVar1 = 0;
    do {
      Timer::removeTimedEvent((this->mTimers).mData[uVar1],eventId,dispatcher);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (this->mTimers).mSize);
  }
  AutoLock::~AutoLock(&AStack_38);
  return;
}

Assistant:

void TimerManager::removeTimedEvent( Event::Id eventId,
									 IEventDispatcher *dispatcher )
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	// Lock mutex while accessing/modifying mTimers vector
	AutoLock l(mMutex);
	
	for (unsigned i = 0; i < mTimers.size(); ++i)
	{
		mTimers[i]->removeTimedEvent(eventId, dispatcher);
	}
	
}